

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabText.h
# Opt level: O2

char * tsGetString(char *pCurr,char *pEnd,bool recognizeEscapes,char **resultStringBegin,
                  uint32_t *stringLength)

{
  char *pcVar1;
  char *pcVar2;
  uint32_t uVar3;
  
  pcVar1 = tsScanForQuote(pCurr,pEnd,'\"',recognizeEscapes);
  if (pcVar1 < pEnd) {
    pcVar1 = pcVar1 + 1;
    *resultStringBegin = pcVar1;
    pcVar2 = tsScanForQuote(pcVar1,pEnd,'\"',recognizeEscapes);
    uVar3 = 0;
    if (pcVar2 <= pEnd) {
      uVar3 = (int)pcVar2 - (int)pcVar1;
    }
    pcVar1 = pcVar2 + 1;
  }
  else {
    uVar3 = 0;
  }
  *stringLength = uVar3;
  return pcVar1;
}

Assistant:

char const* tsGetString(
    char const* pCurr, char const* pEnd,
    bool recognizeEscapes,
    char const** resultStringBegin, uint32_t* stringLength)
{
    Assert(pCurr && pEnd && pEnd >= pCurr);

    pCurr = tsScanForQuote(pCurr, pEnd, '\"', recognizeEscapes);

    if (pCurr < pEnd)
    {
        ++pCurr;    // skip past quote
        *resultStringBegin = pCurr;

        pCurr = tsScanForQuote(pCurr, pEnd, '\"', recognizeEscapes);

        if (pCurr <= pEnd)
            *stringLength = (uint32_t)(pCurr - *resultStringBegin);
        else
            *stringLength = 0;

        ++pCurr;    // point past closing quote
    }
    else
        *stringLength = 0;

    return pCurr;
}